

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  size_type pos;
  pointer pcVar2;
  
  pos = anon_unknown.dwarf_14c2e::filename_pos
                  (&this->m_pathname,(this->m_pathname)._M_string_length);
  pcVar2 = (this->m_pathname)._M_dataplus._M_p;
  if (((pos != 0) && ((this->m_pathname)._M_string_length != 0)) && (pcVar2[pos] == '/')) {
    bVar1 = anon_unknown.dwarf_14c2e::is_root_separator(&this->m_pathname,pos);
    if (!bVar1) {
      detail::dot_path();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&detail::dot_path::dot_pth);
      return __return_storage_ptr__;
    }
    pcVar2 = (this->m_pathname)._M_dataplus._M_p;
  }
  path(__return_storage_ptr__,pcVar2 + pos);
  return __return_storage_ptr__;
}

Assistant:

path path::filename() const
  {
    size_type pos(filename_pos(m_pathname, m_pathname.size()));
    return (m_pathname.size()
              && pos
              && is_separator(m_pathname[pos])
              && !is_root_separator(m_pathname, pos))
      ? detail::dot_path()
      : path(m_pathname.c_str() + pos);
  }